

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O0

string * upperCaseFirst(string *__return_storage_ptr__,string *input)

{
  int iVar1;
  char *pcVar2;
  undefined1 *puVar3;
  string *input_local;
  string *output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  iVar1 = toupper((int)*pcVar2);
  puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *puVar3 = (char)iVar1;
  return __return_storage_ptr__;
}

Assistant:

std::string upperCaseFirst (const std::string& input)
{
  std::string output {input};
  output[0] = toupper (output[0]);
  return output;
}